

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void setup_movable_items(tgestate_t *state)

{
  room_t rVar1;
  tgestate_t *in_RDI;
  character_t character;
  tgestate_t *unaff_retaddr;
  movableitem_t *movableitem;
  tgestate_t *in_stack_00000060;
  tgestate_t *in_stack_fffffffffffffff0;
  
  reset_nonplayer_visible_characters(in_stack_fffffffffffffff0);
  rVar1 = in_RDI->room_index;
  if (rVar1 == '\x02') {
    setup_movable_item(unaff_retaddr,(movableitem_t *)in_RDI,
                       (character_t)((ulong)in_RDI->movable_items >> 0x38));
  }
  else if (rVar1 == '\x04') {
    setup_movable_item(unaff_retaddr,(movableitem_t *)in_RDI,
                       (character_t)((ulong)(in_RDI->movable_items + 2) >> 0x38));
  }
  else if (rVar1 == '\t') {
    setup_movable_item(unaff_retaddr,(movableitem_t *)in_RDI,
                       (character_t)((ulong)(in_RDI->movable_items + 1) >> 0x38));
  }
  spawn_characters(state);
  mark_nearby_items(in_RDI);
  animate(in_stack_00000060);
  move_map(unaff_retaddr);
  plot_sprites(unaff_retaddr);
  return;
}

Assistant:

void setup_movable_items(tgestate_t *state)
{
  const movableitem_t *movableitem;
  character_t          character;

  assert(state != NULL);

  reset_nonplayer_visible_characters(state);

  /* Conv: Use a switch statement rather than if-else and gotos. */

  switch (state->room_index)
  {
  case room_2_HUT2LEFT:
    movableitem = &state->movable_items[movable_item_STOVE1];
    character   = character_26_STOVE_1;
    setup_movable_item(state, movableitem, character);
    break;

  case room_4_HUT3LEFT:
    movableitem = &state->movable_items[movable_item_STOVE2];
    character   = character_27_STOVE_2;
    setup_movable_item(state, movableitem, character);
    break;

  case room_9_CRATE:
    movableitem = &state->movable_items[movable_item_CRATE];
    character   = character_28_CRATE;
    setup_movable_item(state, movableitem, character);
    break;

  default:
    break;
  }

  spawn_characters(state);
  mark_nearby_items(state);
  animate(state);
  move_map(state);
  plot_sprites(state);
}